

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::TPZMHMeshControl
          (TPZMHMeshControl *this,TPZAutoPointer<TPZGeoMesh> *gmesh,TPZVec<long> *geotomhm)

{
  bool bVar1;
  int dim;
  TPZMultiphysicsCompMesh *pTVar2;
  TPZCompMesh *this_00;
  TPZGeoMesh *this_01;
  TPZVec<long> *in_RDX;
  TPZAutoPointer *in_RSI;
  undefined8 *in_RDI;
  int64_t c;
  int64_t nc;
  size_t in_stack_00000328;
  char *in_stack_00000330;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  TPZAutoPointer<TPZGeoMesh> *in_stack_ffffffffffffff10;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffff20;
  TPZMultiphysicsCompMesh *in_stack_ffffffffffffff28;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffff30;
  TPZAutoPointer<TPZGeoMesh> *in_stack_ffffffffffffff38;
  TPZMultiphysicsCompMesh *this_02;
  TPZVec<long> *in_stack_ffffffffffffff48;
  key_type_conflict1 *__k;
  TPZManVector<long,_10> *in_stack_ffffffffffffff50;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *this_03;
  long local_38;
  
  *in_RDI = &PTR__TPZMHMeshControl_025a2ca0;
  TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer
            (in_stack_ffffffffffffff10,
             (TPZAutoPointer<TPZGeoMesh> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff20);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff20);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff20);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff20);
  *(undefined4 *)(in_RDI + 6) = 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  *(undefined4 *)(in_RDI + 7) = 4;
  *(undefined4 *)((long)in_RDI + 0x3c) = 3;
  *(undefined4 *)(in_RDI + 8) = 6;
  *(undefined4 *)((long)in_RDI + 0x44) = 0x226;
  *(undefined4 *)(in_RDI + 9) = 0x227;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e07696);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e076ac);
  *(undefined4 *)(in_RDI + 0x16) = 1;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1;
  *(undefined4 *)(in_RDI + 0x17) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 500;
  *(undefined4 *)(in_RDI + 0x18) = 0x1f6;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0x1f5;
  TPZManVector<long,_10>::TPZManVector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __k = in_RDI + 0x27;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             0x1e0773f);
  this_03 = (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
            (in_RDI + 0x2d);
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         *)0x1e07758);
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::map((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
         *)0x1e07771);
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ca) = 0;
  in_RDI[0x3a] = 0xffffffffffffffff;
  in_RDI[0x3b] = 0xffffffffffffffff;
  in_RDI[0x3c] = 0xffffffffffffffff;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
  }
  *(undefined4 *)(in_RDI + 0x16) = 2;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1;
  pTVar2 = (TPZMultiphysicsCompMesh *)TPZVec<long>::size(in_RDX);
  this_02 = pTVar2;
  for (local_38 = 0; local_38 < (long)pTVar2; local_38 = local_38 + 1) {
    in_stack_ffffffffffffff30 = (TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x27);
    in_stack_ffffffffffffff38 =
         (TPZAutoPointer<TPZGeoMesh> *)TPZVec<long>::operator[](in_RDX,local_38);
    in_stack_ffffffffffffff28 =
         (TPZMultiphysicsCompMesh *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](this_03,__k);
    *(mapped_type_conflict *)&in_stack_ffffffffffffff28->super_TPZCompMesh = -1;
  }
  operator_new(0x9a8);
  TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer
            (in_stack_ffffffffffffff10,
             (TPZAutoPointer<TPZGeoMesh> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(this_02,in_stack_ffffffffffffff38);
  TPZAutoPointer<TPZCompMesh>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(in_stack_ffffffffffffff10);
  this_00 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  this_01 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  dim = TPZGeoMesh::Dimension(this_01);
  TPZCompMesh::SetDimModel(this_00,dim);
  TPZAutoPointer<TPZCompMesh>::operator=
            ((TPZAutoPointer<TPZCompMesh> *)this_00,(TPZAutoPointer<TPZCompMesh> *)this_01);
  return;
}

Assistant:

TPZMHMeshControl::TPZMHMeshControl(TPZAutoPointer<TPZGeoMesh> gmesh, TPZVec<int64_t> &geotomhm) : fGMesh(gmesh), fProblemType(EScalar), fNState(1), fGeoToMHMDomain(geotomhm), fMHMtoSubCMesh(), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
{
    if(!gmesh) DebugStop();
#ifdef PZDEBUG
    if (geotomhm.size() != fGMesh->NElements()) {
        DebugStop();
    }
#endif
    fpOrderInternal = 2;
    fpOrderSkeleton = 1;

    int64_t nc = geotomhm.size();
    for (int64_t c=0; c<nc; c++) {
        fMHMtoSubCMesh[geotomhm[c] ] = -1;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Coarse element indexes ";
        for (std::map<int64_t,int64_t>::iterator it=fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << *it << " ";
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCMesh = new TPZMultiphysicsCompMesh(fGMesh);
    fCMesh->SetDimModel(fGMesh->Dimension());
    fPressureFineMesh = fCMesh;
}